

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsPublicationPublishVector
               (HelicsPublication pub,double *vectorInput,int vectorLength,HelicsError *err)

{
  HelicsPublication pvVar1;
  vector<double,_std::allocator<double>_> local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (pub == (HelicsPublication)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a87cf;
    }
    else {
      pvVar1 = (HelicsPublication)0x0;
      if (*pub == -0x684eff5b) {
        pvVar1 = pub;
      }
      if (*pub == -0x684eff5b || err == (HelicsError *)0x0) goto LAB_001a87d1;
    }
    err->error_code = -3;
    err->message = "The given publication object does not point to a valid object";
  }
LAB_001a87cf:
  pvVar1 = (HelicsPublication)0x0;
LAB_001a87d1:
  if (pvVar1 != (HelicsPublication)0x0) {
    if (vectorInput == (double *)0x0 || vectorLength < 1) {
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      helics::Publication::publish(*(Publication **)((long)pvVar1 + 0x18),&local_28);
      if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      helics::Publication::publish(*(Publication **)((long)pvVar1 + 0x18),vectorInput,vectorLength);
    }
  }
  return;
}

Assistant:

void helicsPublicationPublishVector(HelicsPublication pub, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            pubObj->pubPtr->publish(std::vector<double>());
        } else {
            pubObj->pubPtr->publish(vectorInput, vectorLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}